

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O0

void __thiscall RandomSO3IsInM::test_method(RandomSO3IsInM *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  Index size;
  basic_cstring<const_char> local_300;
  basic_cstring<const_char> local_2f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e0;
  assertion_result local_2c0;
  basic_cstring<const_char> local_2a8;
  basic_cstring<const_char> local_298;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_288 [24];
  RandomReturnType local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_240;
  assertion_result local_220;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8 [2];
  Point local_1d8 [8];
  Point y;
  undefined1 local_b0 [8];
  SO3<mnf::ExpMapQuaternion> S;
  RandomSO3IsInM *this_local;
  
  S.trustMagnitude_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (double)this;
  mnf::SO3<mnf::ExpMapQuaternion>::SO3((SO3<mnf::ExpMapQuaternion> *)local_b0);
  mnf::Manifold::createRandomPoint(1.0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1f8,0x5b,&local_208);
    bVar2 = mnf::Point::isInM(1e-12);
    boost::test_tools::assertion_result::assertion_result(&local_220,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,"y.isInM()",9);
    boost::unit_test::operator<<(&local_240,plVar4,&local_250);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
               ,0x72);
    boost::test_tools::tt_detail::report_assertion(&local_220,&local_240,&local_260,0x5b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_240);
    boost::test_tools::assertion_result::~assertion_result(&local_220);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  size = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random(&local_270,size);
  mnf::SubPoint::value();
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::operator=
            (local_288,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_270);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_298,0x5d,&local_2a8);
    bVar2 = mnf::Point::isInM(1e-12);
    boost::test_tools::assertion_result::assertion_result(&local_2c0,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,"!y.isInM()",10);
    boost::unit_test::operator<<(&local_2e0,plVar4,&local_2f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
               ,0x72);
    boost::test_tools::tt_detail::report_assertion(&local_2c0,&local_2e0,&local_300,0x5d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e0);
    boost::test_tools::assertion_result::~assertion_result(&local_2c0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  mnf::Point::~Point(local_1d8);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3((SO3<mnf::ExpMapQuaternion> *)local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomSO3IsInM)
{
  SO3<ExpMapQuaternion> S;
  Point y = S.createRandomPoint();
  BOOST_CHECK(y.isInM());
  y.value() = Eigen::VectorXd::Random(S.representationDim());
  BOOST_CHECK(!y.isInM());
}